

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

Vector<128> * __thiscall
Matrix<128,_784>::operator*
          (Vector<128> *__return_storage_ptr__,Matrix<128,_784> *this,Vector<784> *vector)

{
  pointer pdVar1;
  pointer pvVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  int j;
  long lVar6;
  double dVar7;
  
  Vector<128>::Vector(__return_storage_ptr__);
  pdVar1 = (vector->m_Vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar2 = (this->m_Matrix).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (__return_storage_ptr__->m_Vector).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
    lVar4 = *(long *)&pvVar2[lVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl;
    dVar7 = pdVar3[lVar5];
    for (lVar6 = 0; lVar6 != 0x310; lVar6 = lVar6 + 1) {
      dVar7 = dVar7 + pdVar1[lVar6] * *(double *)(lVar4 + lVar6 * 8);
      pdVar3[lVar5] = dVar7;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<ROWS> operator*(const Vector<COLS> &vector) const
    {
        Vector<ROWS> result{};
        for (int i = 0; i < ROWS; ++i)
        {
            for (int j = 0; j < COLS; ++j)
            {
                result[i] += vector[j] * m_Matrix[i][j];
            }
        }

        return result;
    }